

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O0

void * Husky::ServerFrame::ServerThread(void *lpParameter)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  string *this;
  ssize_t sVar4;
  void *__buf;
  size_t __n;
  int *in_RDI;
  char chHttpHeader [2048];
  string strSnd;
  string strRec;
  HttpReqInfo httpReq;
  socklen_t nSize;
  sockaddr_in clientaddr;
  string strHttpResp;
  SOCKET hClientSock;
  char chRecvBuf [10240];
  linger lng;
  int nRetCode;
  pthread_mutex_t *ppmAccept;
  bool *pShutdown;
  IRequestHandler *pHandler;
  SOCKET hSockLsn;
  SPara *pPara;
  string *in_stack_ffffffffffffcc28;
  HttpReqInfo *in_stack_ffffffffffffcc30;
  string *local_33c8;
  char *local_3388;
  char *local_3370;
  char *local_3338;
  char *local_3320;
  char *local_3308;
  char *local_32d8;
  allocator<char> local_32c9;
  string local_32c8 [16];
  string *in_stack_ffffffffffffcf80;
  HttpReqInfo *in_stack_ffffffffffffcf88;
  allocator local_2a99;
  string local_2a98 [39];
  allocator local_2a71;
  string local_2a70 [32];
  string local_2a50 [32];
  string local_2a30 [39];
  allocator local_2a09;
  string local_2a08 [39];
  allocator local_29e1;
  string local_29e0 [39];
  allocator local_29b9;
  string local_29b8 [39];
  allocator local_2991;
  string local_2990 [36];
  in_addr_t local_296c;
  undefined4 local_2968;
  allocator local_2961;
  string local_2960 [48];
  undefined1 local_2930 [172];
  socklen_t local_2884;
  undefined1 local_2880 [16];
  string local_2870 [36];
  int local_284c;
  char local_2848 [10252];
  undefined4 local_3c;
  undefined4 local_38;
  int local_34;
  pthread_mutex_t *local_30;
  byte *local_28;
  long *local_20;
  int local_14;
  
  local_14 = *in_RDI;
  local_20 = *(long **)(in_RDI + 2);
  local_28 = *(byte **)(in_RDI + 6);
  local_30 = *(pthread_mutex_t **)(in_RDI + 4);
  std::__cxx11::string::string(local_2870);
  local_2884 = 0x10;
  local_33c8 = in_stack_ffffffffffffcc28;
  while (((*local_28 ^ 0xff) & 1) != 0) {
    HttpReqInfo::HttpReqInfo(in_stack_ffffffffffffcc30);
    pthread_mutex_lock(local_30);
    local_284c = accept(local_14,(sockaddr *)local_2880,&local_2884);
    pthread_mutex_unlock(local_30);
    if (local_284c == -1) {
      if ((*local_28 & 1) == 0) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_32d8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_32d8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                               ,0x2f);
          local_32d8 = local_32d8 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2960,"error [%s]",&local_2961);
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        Limonp::Logger::LoggingF(3,local_32d8,0xe4,(string *)local_2960,pcVar2);
        std::__cxx11::string::~string(local_2960);
        std::allocator<char>::~allocator((allocator<char> *)&local_2961);
      }
      local_2968 = 2;
    }
    else {
      local_296c = local_2880._4_4_;
      pcVar2 = inet_ntoa((in_addr)local_2880._4_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2990,"CLIENT_IP",&local_2991);
      this = HttpReqInfo::operator[](in_stack_ffffffffffffcc30,local_33c8);
      std::__cxx11::string::operator=((string *)this,pcVar2);
      std::__cxx11::string::~string(local_2990);
      std::allocator<char>::~allocator((allocator<char> *)&local_2991);
      local_38 = 1;
      local_3c = 1;
      iVar1 = setsockopt(local_284c,1,0xd,&local_3c,8);
      if (iVar1 == -1) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_3308 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_3308 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                               ,0x2f);
          local_3308 = local_3308 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_29b8,"error [%s]",&local_29b9);
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        Limonp::Logger::LoggingF(3,local_3308,0xee,(string *)local_29b8,pcVar2);
        std::__cxx11::string::~string(local_29b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_29b9);
      }
      iVar1 = setsockopt(local_284c,1,0x14,SOCKET_TIMEOUT,0x10);
      if (iVar1 == -1) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_3320 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_3320 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                               ,0x2f);
          local_3320 = local_3320 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_29e0,"error [%s]",&local_29e1);
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        Limonp::Logger::LoggingF(3,local_3320,0xf3,(string *)local_29e0,pcVar2);
        std::__cxx11::string::~string(local_29e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_29e1);
      }
      iVar1 = setsockopt(local_284c,1,0x15,SOCKET_TIMEOUT,0x10);
      if (iVar1 == -1) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_3338 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_3338 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                               ,0x2f);
          local_3338 = local_3338 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a08,"error [%s]",&local_2a09);
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        Limonp::Logger::LoggingF(3,local_3338,0xf8,(string *)local_2a08,pcVar2);
        std::__cxx11::string::~string(local_2a08);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a09);
      }
      std::__cxx11::string::string(local_2a30);
      std::__cxx11::string::string(local_2a50);
      memset(local_2848,0,0x2800);
      sVar4 = recv(local_284c,local_2848,0x2800,0);
      local_34 = (int)sVar4;
      std::__cxx11::string::operator=(local_2a30,local_2848);
      if (local_34 == -1) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_3370 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_3370 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                               ,0x2f);
          local_3370 = local_3370 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a70,"error [%s]",&local_2a71);
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        Limonp::Logger::LoggingF(0,local_3370,0x108,(string *)local_2a70,pcVar2);
        std::__cxx11::string::~string(local_2a70);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a71);
        close(local_284c);
        local_2968 = 2;
      }
      else if (local_34 == 0) {
        pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                         ,0x2f);
        if (pcVar2 == (char *)0x0) {
          local_3388 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
          ;
        }
        else {
          local_3388 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                               ,0x2f);
          local_3388 = local_3388 + 1;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2a98,"connection has been gracefully closed",&local_2a99)
        ;
        Limonp::Logger::LoggingF(0,local_3388,0x10e,(string *)local_2a98);
        std::__cxx11::string::~string(local_2a98);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a99);
        close(local_284c);
        local_2968 = 2;
      }
      else {
        HttpReqInfo::load(in_stack_ffffffffffffcf88,in_stack_ffffffffffffcf80);
        (**(code **)(*local_20 + 0x20))(local_20,local_2930,local_2a50);
        std::__cxx11::string::length();
        sprintf(&stack0xffffffffffffcd58,
                "HTTP/1.1 200 OK\r\nConnection: close\r\nServer: FrameServer/1.0.0\r\nContent-Type: text/json; charset=%s\r\nContent-Length: %d\r\n\r\n"
                ,"UTF-8");
        std::__cxx11::string::operator=(local_2870,&stack0xffffffffffffcd58);
        std::__cxx11::string::operator+=(local_2870,local_2a50);
        iVar1 = local_284c;
        __buf = (void *)std::__cxx11::string::c_str();
        __n = std::__cxx11::string::length();
        sVar4 = send(iVar1,__buf,__n,0);
        if (sVar4 == -1) {
          pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                           ,0x2f);
          if (pcVar2 == (char *)0x0) {
            local_33c8 = (string *)0x14fb6f;
          }
          else {
            local_33c8 = (string *)
                         strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Husky/ServerFrame.hpp"
                                 ,0x2f);
            local_33c8 = (string *)((char *)local_33c8 + 1);
          }
          in_stack_ffffffffffffcc30 = (HttpReqInfo *)&local_32c9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_32c8,"error [%s]",(allocator *)in_stack_ffffffffffffcc30);
          piVar3 = __errno_location();
          pcVar2 = strerror(*piVar3);
          Limonp::Logger::LoggingF(3,(char *)local_33c8,0x122,(string *)local_32c8,pcVar2);
          std::__cxx11::string::~string(local_32c8);
          std::allocator<char>::~allocator(&local_32c9);
        }
        close(local_284c);
        local_2968 = 0;
      }
      std::__cxx11::string::~string(local_2a50);
      std::__cxx11::string::~string(local_2a30);
    }
    HttpReqInfo::~HttpReqInfo(in_stack_ffffffffffffcc30);
  }
  local_2968 = 1;
  std::__cxx11::string::~string(local_2870);
  return (void *)0x0;
}

Assistant:

static void * ServerThread(void * lpParameter )
            {
                SPara *pPara=(SPara*)lpParameter;
                SOCKET hSockLsn=pPara->hSock;
                IRequestHandler *pHandler=pPara->pHandler;
                bool* pShutdown = pPara->pShutdown;
                pthread_mutex_t* ppmAccept = pPara->ppmAccept;

                int nRetCode;
                linger lng;
                char chRecvBuf[RECV_BUFFER];

                SOCKET hClientSock;
                string strHttpResp;

                sockaddr_in clientaddr;
                socklen_t nSize = sizeof(clientaddr);
                while(!(*pShutdown))
                {		
                    HttpReqInfo httpReq;
                    pthread_mutex_lock(ppmAccept);
                    hClientSock=accept(hSockLsn,(sockaddr *)&clientaddr, &nSize);
                    pthread_mutex_unlock(ppmAccept);

                    if(hClientSock==SOCKET_ERROR)
                    {
                        if(!(*pShutdown))
                          LogError("error [%s]", strerror(errno));
                        continue;
                    }

                    httpReq[CLIENT_IP_K] = inet_ntoa(clientaddr.sin_addr);// inet_ntoa is not thread safety at some version 

                    lng.l_linger=1;
                    lng.l_onoff=1;				
                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_LINGER,(char*)&lng,sizeof(lng)))			
                    {
                        LogError("error [%s]", strerror(errno));
                    }

                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_RCVTIMEO,(char*)&SOCKET_TIMEOUT,sizeof(SOCKET_TIMEOUT)))
                    {
                        LogError("error [%s]", strerror(errno));
                    }

                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_SNDTIMEO,(char*)&SOCKET_TIMEOUT,sizeof(SOCKET_TIMEOUT)))
                    {
                        LogError("error [%s]", strerror(errno));
                    }


                    string strRec;
                    string strSnd;
                    memset(chRecvBuf,0,sizeof(chRecvBuf));
                    nRetCode = recv(hClientSock, chRecvBuf, RECV_BUFFER, 0);	
                    strRec = chRecvBuf;

#ifdef HUKSY_DEBUG
                    LogDebug("request[%s]", strRec.c_str());
#endif

                    if(SOCKET_ERROR==nRetCode)
                    {
                        LogDebug("error [%s]", strerror(errno));
                        closesocket(hClientSock);
                        continue;
                    }
                    if(0==nRetCode)
                    {
                        LogDebug("connection has been gracefully closed");
                        closesocket(hClientSock);
                        continue;
                    }
                    httpReq.load(strRec);

                    pHandler->do_GET(httpReq, strSnd);

                    char chHttpHeader[2048];

                    sprintf(chHttpHeader, RESPONSE_FORMAT, RESPONSE_CHARSET_UTF8, int(strSnd.length()));

                    strHttpResp=chHttpHeader;
                    strHttpResp+=strSnd;
#ifdef HUKSY_DEBUG
                    LogDebug("response'body [%s]", strSnd.c_str());
#endif

                    if (SOCKET_ERROR==send(hClientSock,strHttpResp.c_str(),strHttpResp.length(),0))
                    {
                        LogError("error [%s]", strerror(errno));
                    }


                    closesocket(hClientSock);
                }

                return 0;

            }